

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QSslCertificateExtensionPrivate>::reset
          (QSharedDataPointer<QSslCertificateExtensionPrivate> *this,
          QSslCertificateExtensionPrivate *ptr)

{
  bool bVar1;
  QSslCertificateExtensionPrivate *pQVar2;
  QSslCertificateExtensionPrivate *in_RSI;
  QSslCertificateExtensionPrivate *in_RDI;
  long in_FS_OFFSET;
  QSslCertificateExtensionPrivate *old;
  totally_ordered_wrapper<QSslCertificateExtensionPrivate_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QSslCertificateExtensionPrivate_*> local_18;
  totally_ordered_wrapper<QSslCertificateExtensionPrivate_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QSslCertificateExtensionPrivate_*>::get
                     ((totally_ordered_wrapper<QSslCertificateExtensionPrivate_*> *)in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QSslCertificateExtensionPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x2762fc);
    }
    Qt::totally_ordered_wrapper<QSslCertificateExtensionPrivate_*>::totally_ordered_wrapper
              (&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QSslCertificateExtensionPrivate*>,Qt::totally_ordered_wrapper<QSslCertificateExtensionPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QSslCertificateExtensionPrivate_*> *)0x27631a);
    pQVar2 = Qt::totally_ordered_wrapper<QSslCertificateExtensionPrivate_*>::get(&local_10);
    if (((pQVar2 != (QSslCertificateExtensionPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x276340), !bVar1)) &&
       (pQVar2 != (QSslCertificateExtensionPrivate *)0x0)) {
      QSslCertificateExtensionPrivate::~QSslCertificateExtensionPrivate(in_RDI);
      operator_delete(pQVar2,0x60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }